

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O2

void dbgpval(dbgcxdef *ctx,runsdef *val,_func_void_void_ptr_char_ptr_int *dispfn,void *dispctx,
            int showtype)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  char *__s;
  ulong uStack_70;
  uint len;
  uchar *p;
  uchar buf [40];
  
  p = buf;
  switch(val->runstyp) {
  case '\x01':
    sprintf((char *)buf,"%ld",(val->runsv).runsvnum);
    uStack_70 = strlen((char *)buf);
    len = (uint)uStack_70;
    __s = "number";
    break;
  case '\x02':
    len = dbgnam(ctx,(char *)buf,2,(uint)(val->runsv).runsvobj);
    uStack_70 = (ulong)len;
    __s = "object";
    break;
  case '\x03':
    len = *(ushort *)(val->runsv).runsvstr - 2;
    uStack_70 = (ulong)len;
    p = (uchar *)((long)(val->runsv).runsvstr + 2);
    __s = "string";
    break;
  default:
    p = "[unknown type]";
    len = 0xe;
    uStack_70 = 0xe;
    goto LAB_00120174;
  case '\x05':
    p = "nil";
    len = 3;
    uStack_70 = 3;
    goto LAB_00120174;
  case '\a':
    if (showtype != 0) {
      (*dispfn)(dispctx,"list: ",6);
    }
    (*dispfn)(dispctx,"[",1);
    len = *(ushort *)(val->runsv).runsvstr - 2;
    p = (uchar *)((long)(val->runsv).runsvstr + 2);
    uVar2 = len;
    while (uVar2 != 0) {
      dbgpbval(ctx,(uint)*p,p + 1,dispfn,dispctx);
      lstadv(&p,&len);
      uVar2 = 0;
      if (len != 0) {
        (*dispfn)(dispctx," ",1);
        uVar2 = len;
      }
    }
    (*dispfn)(dispctx,"]",1);
    len = 0;
    uStack_70 = 0;
    goto LAB_0012021c;
  case '\b':
    p = "true";
    len = 4;
    uStack_70 = 4;
LAB_00120174:
    bVar1 = false;
    goto LAB_00120242;
  case '\n':
    len = dbgnam(ctx,(char *)buf,1,(uint)(val->runsv).runsvobj);
    uStack_70 = (ulong)len;
    __s = "function pointer";
    break;
  case '\r':
    len = dbgnam(ctx,(char *)buf,3,(uint)(val->runsv).runsvobj);
    uStack_70 = (ulong)len;
    __s = "property pointer";
  }
  if (showtype == 0) {
LAB_0012021c:
    if (val->runstyp == '\x03') {
      (*dispfn)(dispctx,"\'",1);
      bVar1 = false;
      uStack_70 = (ulong)len;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    sVar3 = strlen(__s);
    (*dispfn)(dispctx,__s,(int)sVar3);
    (*dispfn)(dispctx,": ",2);
    bVar1 = true;
  }
  uVar4 = (uint)uStack_70;
  if (uVar4 < 0x28) {
LAB_00120242:
    uVar4 = (uint)uStack_70;
    buf[uStack_70 & 0xffffffff] = '\0';
  }
  if ((val->runstyp == '\r') || (val->runstyp == '\n')) {
    (*dispfn)(dispctx,"&",1);
    uVar4 = len;
  }
  if (uVar4 != 0) {
    (*dispfn)(dispctx,(char *)p,uVar4);
  }
  if (!bVar1 && val->runstyp == '\x03') {
    (*dispfn)(dispctx,"\'",1);
  }
  return;
}

Assistant:

void dbgpval(dbgcxdef *ctx, runsdef *val,
             void (*dispfn)(void *ctx, const char *str, int strl),
             void *dispctx,
             int showtype)
{
    uchar   buf[TOKNAMMAX + 1];
    uint    len;
    uchar  *p = buf;
    char   *typ = 0;
    
    switch(val->runstyp)
    {
    case DAT_NUMBER:
        sprintf((char *)buf, "%ld", val->runsv.runsvnum);
        len = strlen((char *)buf);
        typ = "number";
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, (char *)buf, TOKSTOBJ, val->runsv.runsvobj);
        typ = "object";
        break;
        
    case DAT_SSTRING:
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        typ = "string";
        break;
        
    case DAT_NIL:
        p = (uchar *)"nil";
        len = 3;
        break;

    case DAT_LIST:
        if (showtype) (*dispfn)(dispctx, "list: ", 6);
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv(&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = (uchar *)"true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        len = dbgnam(ctx, (char *)buf, TOKSTFUNC, val->runsv.runsvobj);
        typ = "function pointer";
        break;
        
    case DAT_PROPNUM:
        len = dbgnam(ctx, (char *)buf, TOKSTPROP, val->runsv.runsvprp);
        typ = "property pointer";
        break;
        
    default:
        p = (uchar *)"[unknown type]";
        len = 14;
        break;
    }

    /* show the type prefix if desired, or add a quote if it's a string */
    if (typ && showtype)
    {
        /* show the type prefix */
        (*dispfn)(dispctx, typ, (int)strlen(typ));
        (*dispfn)(dispctx, ": ", 2);
    }
    else if (val->runstyp == DAT_SSTRING)
    {
        /* it's a string, and we're not showing a type - add a quote */
        (*dispfn)(dispctx, "'", 1);
    }

    /* 
     *   if possible, null-terminate the buffer - do this only if the
     *   length is actually within the buffer, which won't be the case if
     *   the text comes from someplace outside the buffer (which is the
     *   case if it's a string, for example) 
     */
    if (len < sizeof(buf))
        buf[len] = '\0';

    /* display a "&" prefix if it's an address of some kind */
    if (val->runstyp == DAT_PROPNUM || val->runstyp == DAT_FNADDR)
        (*dispfn)(dispctx, "&", 1);

    /* display the text */
    if (len != 0)
        (*dispfn)(dispctx, (char *)p, len);

    /* add a closing quote if it's a string and we showed an open quote */
    if (val->runstyp == DAT_SSTRING && !(typ && showtype))
        (*dispfn)(dispctx, "'", 1);
}